

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

string * pstore::basic_logger::get_current_thread_name_abi_cxx11_(void)

{
  __atomic_base<int> *p_Var1;
  atomic<int> aVar2;
  __atomic_base<int> _Var3;
  ostream *poVar4;
  string *in_RDI;
  long *in_FS_OFFSET;
  string name;
  ostringstream str;
  
  threads::get_name_abi_cxx11_();
  aVar2 = get_current_thread_name::nextid;
  if (name._M_string_length == 0) {
    p_Var1 = (__atomic_base<int> *)(*in_FS_OFFSET + -0x10);
    if (p_Var1->_M_i == -1) {
      LOCK();
      UNLOCK();
      _Var3._M_i = (get_current_thread_name::nextid.super___atomic_base<int>._M_i + 1)._M_i;
      p_Var1->_M_i = (__int_type)get_current_thread_name::nextid.super___atomic_base<int>._M_i;
      get_current_thread_name::nextid.super___atomic_base<int>._M_i =
           (__atomic_base<int>)(__atomic_base<int>)_Var3._M_i;
      if (aVar2.super___atomic_base<int>._M_i == -1) {
        assert_failed("id != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/logging.cpp"
                      ,0x18c);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    poVar4 = std::operator<<((ostream *)&str,'(');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,p_Var1->_M_i);
    std::operator<<(poVar4,')');
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,(string *)&name);
  }
  std::__cxx11::string::~string((string *)&name);
  return in_RDI;
}

Assistant:

std::string basic_logger::get_current_thread_name () {
            std::string const name = threads::get_name ();
            if (!name.empty ()) {
                return name;
            }

            // If a thread name hasn't been explicitly set (or has been explictly set
            // to an empty string), then construct something that allows us to
            // identify this thread in the logs.
            thread_local auto id = -1;
            if (id == -1) {
                static std::atomic<int> nextid;
                id = nextid++;
                PSTORE_ASSERT (id != -1);
            }

            std::ostringstream str;
            str << '(' << id << ')';
            return str.str ();
        }